

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::EntrySymbolSearch(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  Var instance;
  JavascriptString *string;
  Var lastIndex;
  Var instance_00;
  undefined1 *puVar7;
  int in_stack_00000010;
  undefined1 local_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,800,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb197c;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x321,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bb197c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pRVar6 = GetThisObject((Arguments *)local_48,L"RegExp.prototype[Symbol.search]",pSVar1);
  instance = Arguments::operator[]((Arguments *)local_48,0);
  string = GetFirstStringArg((Arguments *)local_48,pSVar1);
  lastIndex = JavascriptOperators::GetProperty(pRVar6,0x1a2,pSVar1,(PropertyValueInfo *)0x0);
  SetLastIndexProperty(instance,&DAT_1000000000000,pSVar1);
  instance_00 = CallExec(pRVar6,string,L"RegExp.prototype[Symbol.search]",pSVar1);
  SetLastIndexProperty(instance,lastIndex,pSVar1);
  BVar4 = JavascriptOperators::IsNull(instance_00);
  if (BVar4 == 0) {
    pRVar6 = VarTo<Js::RecyclableObject>(instance_00);
    puVar7 = (undefined1 *)
             JavascriptOperators::GetProperty(pRVar6,0x1da,pSVar1,(PropertyValueInfo *)0x0);
  }
  else {
    puVar7 = &DAT_10000ffffffff;
  }
  return puVar7;
}

Assistant:

Var JavascriptRegExp::EntrySymbolSearch(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, RegexSymbolSearch, scriptContext);

        PCWSTR const varName = _u("RegExp.prototype[Symbol.search]");

        RecyclableObject *thisObj = GetThisObject(args, varName, scriptContext);
        Var regEx = args[0];

        JavascriptString* string = GetFirstStringArg(args, scriptContext);

        Var previousLastIndex = JavascriptOperators::GetProperty(thisObj, PropertyIds::lastIndex, scriptContext);
        SetLastIndexProperty(regEx, TaggedInt::ToVarUnchecked(0), scriptContext);

        Var result = CallExec(thisObj, string, varName, scriptContext);

        SetLastIndexProperty(regEx, previousLastIndex, scriptContext);

        return JavascriptOperators::IsNull(result)
            ? TaggedInt::ToVarUnchecked(-1)
            : JavascriptOperators::GetProperty(VarTo<RecyclableObject>(result), PropertyIds::index, scriptContext);
    }